

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

CURLU * curl_url_dup(CURLU *in)

{
  char *pcVar1;
  Curl_URL *u;
  CURLU *in_local;
  
  in_local = (CURLU *)(*Curl_ccalloc)(0x60,1);
  if (in_local == (CURLU *)0x0) {
    return (CURLU *)0x0;
  }
  if (in->scheme == (char *)0x0) {
LAB_001711e6:
    if (in->user != (char *)0x0) {
      pcVar1 = (*Curl_cstrdup)(in->user);
      in_local->user = pcVar1;
      if (in_local->user == (char *)0x0) goto LAB_001713da;
    }
    if (in->password != (char *)0x0) {
      pcVar1 = (*Curl_cstrdup)(in->password);
      in_local->password = pcVar1;
      if (in_local->password == (char *)0x0) goto LAB_001713da;
    }
    if (in->options != (char *)0x0) {
      pcVar1 = (*Curl_cstrdup)(in->options);
      in_local->options = pcVar1;
      if (in_local->options == (char *)0x0) goto LAB_001713da;
    }
    if (in->host != (char *)0x0) {
      pcVar1 = (*Curl_cstrdup)(in->host);
      in_local->host = pcVar1;
      if (in_local->host == (char *)0x0) goto LAB_001713da;
    }
    if (in->port != (char *)0x0) {
      pcVar1 = (*Curl_cstrdup)(in->port);
      in_local->port = pcVar1;
      if (in_local->port == (char *)0x0) goto LAB_001713da;
    }
    if (in->path != (char *)0x0) {
      pcVar1 = (*Curl_cstrdup)(in->path);
      in_local->path = pcVar1;
      if (in_local->path == (char *)0x0) goto LAB_001713da;
    }
    if (in->query != (char *)0x0) {
      pcVar1 = (*Curl_cstrdup)(in->query);
      in_local->query = pcVar1;
      if (in_local->query == (char *)0x0) goto LAB_001713da;
    }
    if (in->fragment != (char *)0x0) {
      pcVar1 = (*Curl_cstrdup)(in->fragment);
      in_local->fragment = pcVar1;
      if (in_local->fragment == (char *)0x0) goto LAB_001713da;
    }
    in_local->portnum = in->portnum;
  }
  else {
    pcVar1 = (*Curl_cstrdup)(in->scheme);
    in_local->scheme = pcVar1;
    if (in_local->scheme != (char *)0x0) goto LAB_001711e6;
LAB_001713da:
    curl_url_cleanup(in_local);
    in_local = (CURLU *)0x0;
  }
  return in_local;
}

Assistant:

CURLU *curl_url_dup(CURLU *in)
{
  struct Curl_URL *u = calloc(sizeof(struct Curl_URL), 1);
  if(u) {
    DUP(u, in, scheme);
    DUP(u, in, user);
    DUP(u, in, password);
    DUP(u, in, options);
    DUP(u, in, host);
    DUP(u, in, port);
    DUP(u, in, path);
    DUP(u, in, query);
    DUP(u, in, fragment);
    u->portnum = in->portnum;
  }
  return u;
  fail:
  curl_url_cleanup(u);
  return NULL;
}